

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlfparser.h
# Opt level: O2

vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *
xlfparser::tokenize<char>
          (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *__return_storage_ptr__,
          char *formula,size_t size,Options<char> *options)

{
  char *pcVar1;
  pointer pTVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  size_t sVar6;
  _Elt_pointer pTVar7;
  pointer pcVar8;
  invalid_formula *piVar9;
  char cVar10;
  long lVar11;
  char cVar12;
  char *pcVar13;
  undefined **ppuVar14;
  bool bVar15;
  pointer pcVar16;
  pointer pcVar17;
  bool bVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  pointer local_2a8;
  string local_2a0;
  allocator<char> local_279;
  pointer local_278;
  char *local_270;
  vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *local_268;
  uint local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  stack<xlfparser::Token::Type,_std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>_>
  stack;
  _Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_> local_1f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> sn_regex;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> sn_regex_ss;
  ostream local_1a8 [376];
  
  local_278 = (pointer)size;
  if ((size < 2) || (*formula != '=')) {
    piVar9 = (invalid_formula *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sn_regex_ss,"Invalid Excel formula",(allocator<char> *)&stack);
    invalid_formula::invalid_formula(piVar9,(string *)&sn_regex_ss);
    __cxa_throw(piVar9,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
  }
  local_254 = 0x7b;
  if ((options->left_brace).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_254 = (uint)(byte)(options->left_brace).super__Optional_base<char,_true,_true>._M_payload.
                            super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_250 = 0x5b;
  if ((options->left_bracket).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_250 = (uint)(byte)(options->left_bracket).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  bVar18 = (options->right_brace).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_engaged != false;
  uVar4 = (uint)(byte)(options->right_brace).super__Optional_base<char,_true,_true>._M_payload.
                      super__Optional_payload_base<char>._M_payload._M_value;
  local_25c = 0x7d;
  if (bVar18) {
    local_25c = uVar4;
  }
  local_24c = 0x5d;
  if (bVar18) {
    local_24c = uVar4;
  }
  local_260 = 0x2c;
  if ((options->list_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_260 = (uint)(byte)(options->list_separator).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  cVar10 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_payload._M_value;
  bVar18 = (options->decimal_separator).super__Optional_base<char,_true,_true>._M_payload.
           super__Optional_payload_base<char>._M_engaged;
  local_258 = 0x3b;
  if ((options->row_separator).super__Optional_base<char,_true,_true>._M_payload.
      super__Optional_payload_base<char>._M_engaged != false) {
    local_258 = (uint)(byte)(options->row_separator).super__Optional_base<char,_true,_true>.
                            _M_payload.super__Optional_payload_base<char>._M_payload._M_value;
  }
  local_270 = formula;
  std::__cxx11::stringstream::stringstream((stringstream *)&sn_regex_ss);
  poVar5 = std::operator<<(local_1a8,"^[1-9](\\");
  cVar12 = '.';
  if (bVar18 != false) {
    cVar12 = cVar10;
  }
  poVar5 = std::operator<<(poVar5,cVar12);
  std::operator<<(poVar5,"\\d+)?E[+-]\\d*$");
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&sn_regex,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack,0x11);
  std::__cxx11::string::~string((string *)&stack);
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268 = __return_storage_ptr__;
  std::
  stack<xlfparser::Token::Type,std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>>
  ::stack<std::deque<xlfparser::Token::Type,std::allocator<xlfparser::Token::Type>>,void>(&stack);
  pcVar16 = (pointer)0x1;
LAB_00104fcd:
  bVar3 = false;
  bVar19 = false;
  bVar18 = false;
  local_2a8 = pcVar16;
  bVar15 = false;
LAB_00104fe1:
  while( true ) {
    pcVar17 = pcVar16;
    pcVar13 = local_270;
    pcVar16 = local_278;
    if ((local_278 <= pcVar17) || (cVar10 = local_270[(long)pcVar17], cVar10 == '\0')) {
      if ((local_2a8 < pcVar17) &&
         ((pTVar2 = (__return_storage_ptr__->
                    super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl
                    .super__Vector_impl_data._M_finish,
          (__return_storage_ptr__->
          super__Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>)._M_impl.
          super__Vector_impl_data._M_start == pTVar2 || ((pointer)pTVar2[-1].m_end < local_2a8)))) {
        local_2a0._M_string_length = (size_type)(pcVar17 + -1);
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 1;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
      }
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::vector
                ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_1f0,
                 __return_storage_ptr__);
      _fix_whitespace_tokens<char>
                ((vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_2a0,
                 (vector<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_1f0,pcVar13,
                 (size_t)pcVar16);
      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::_M_move_assign
                (__return_storage_ptr__,&local_2a0);
      std::_Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~_Vector_base
                ((_Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_> *)&local_2a0);
      std::_Vector_base<xlfparser::Token,_std::allocator<xlfparser::Token>_>::~_Vector_base
                (&local_1f0);
      _infer_token_subtypes<char>(__return_storage_ptr__,options,pcVar13,(size_t)pcVar16);
      std::_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
      ~_Deque_base((_Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_> *)
                   &stack);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&sn_regex);
      std::__cxx11::stringstream::~stringstream((stringstream *)&sn_regex_ss);
      return __return_storage_ptr__;
    }
    pcVar13 = local_270 + (long)pcVar17;
    if (!bVar3) break;
    if (cVar10 == '\"') {
      if ((local_278 < pcVar17 + 2) || (bVar3 = true, pcVar16 = pcVar17 + 2, pcVar13[1] != '\"')) {
        local_2a0._M_dataplus._M_p = local_2a8;
        local_2a0.field_2._M_allocated_capacity = 0x300000001;
        local_2a0._M_string_length = (size_type)pcVar17;
        std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
        emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
LAB_00105057:
        bVar3 = false;
        local_2a8 = pcVar17 + 1;
        pcVar16 = local_2a8;
      }
    }
    else {
      bVar3 = true;
      pcVar16 = pcVar17 + 1;
    }
  }
  if (!bVar15) {
    if (bVar19) {
      bVar19 = cVar10 != (char)local_24c;
      bVar3 = false;
      bVar15 = false;
      pcVar16 = pcVar17 + 1;
      goto LAB_00104fe1;
    }
    if (bVar18) {
      pcVar13 = local_270 + (long)local_2a8;
      pcVar16 = pcVar17 + 1;
      ppuVar14 = &PTR_anon_var_dwarf_1d0ba_0011ea10;
      while (pcVar1 = *ppuVar14, pcVar1 != (char *)0x0) {
        sVar6 = strlen(pcVar1);
        bVar18 = _str_equals(pcVar1,sVar6,pcVar13,(long)pcVar16 - (long)local_2a8);
        __return_storage_ptr__ = local_268;
        ppuVar14 = ppuVar14 + 1;
        if (bVar18) {
          local_2a0._M_dataplus._M_p = local_2a8;
          local_2a0.field_2._M_allocated_capacity = 0x600000001;
          local_2a0._M_string_length = (size_type)pcVar17;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(local_268,(Token *)&local_2a0);
          goto LAB_00104fcd;
        }
      }
      bVar18 = true;
      bVar3 = false;
      bVar15 = false;
      bVar19 = false;
      __return_storage_ptr__ = local_268;
      goto LAB_00104fe1;
    }
    if (local_2a8 < pcVar17) {
      bVar18 = std::regex_match<char_const*,char,std::__cxx11::regex_traits<char>>
                         (local_270 + (long)local_2a8,pcVar13 + 1,&sn_regex,0);
      if (!bVar18) {
        cVar10 = *pcVar13;
        goto LAB_00105162;
      }
LAB_00105141:
      bVar3 = false;
LAB_0010519f:
      bVar15 = false;
LAB_001051d7:
      bVar19 = false;
    }
    else {
LAB_00105162:
      if (cVar10 == '\'') {
        if (local_2a8 < pcVar17) {
          local_2a0._M_string_length = (size_type)(pcVar17 + -1);
          local_2a0._M_dataplus._M_p = local_2a8;
          local_2a0.field_2._M_allocated_capacity = 0;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
          local_2a8 = pcVar17;
        }
        bVar15 = true;
        bVar3 = false;
        goto LAB_001051d7;
      }
      if (cVar10 == '\"') {
        if (local_2a8 < pcVar17) {
          local_2a0._M_string_length = (size_type)(pcVar17 + -1);
          local_2a0._M_dataplus._M_p = local_2a8;
          local_2a0.field_2._M_allocated_capacity = 0;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
          local_2a8 = pcVar17;
        }
        bVar3 = true;
        goto LAB_0010519f;
      }
      if (cVar10 != (char)local_250) {
        if (cVar10 != '#') {
          if (cVar10 == (char)local_254) {
            if (local_2a8 < pcVar17) {
              local_2a0._M_string_length = (size_type)(pcVar17 + -1);
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity = 0;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
              local_2a8 = pcVar17;
            }
            local_2a0.field_2._M_allocated_capacity = 0x100000003;
            local_2a0._M_dataplus._M_p = local_2a8;
            local_2a0._M_string_length = (size_type)pcVar17;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
            local_2a0.field_2._M_allocated_capacity = 0x100000004;
            local_2a0._M_dataplus._M_p = local_2a8;
            local_2a0._M_string_length = (size_type)pcVar17;
            std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
            emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
            local_2a0._M_dataplus._M_p._0_4_ = 3;
            std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
            emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
            local_2a0._M_dataplus._M_p._0_4_ = 4;
            std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
            emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
          }
          else {
            if ((cVar10 == (char)local_258) &&
               (stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur !=
                stack.c.
                super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur)) {
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar7 = stack.c.
                         super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
              }
              if (pTVar7[-1] == ArrayRow) {
                if (local_2a8 < pcVar17) {
                  local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                  local_2a0._M_dataplus._M_p = local_2a8;
                  local_2a0.field_2._M_allocated_capacity = 1;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  local_2a8 = pcVar17;
                }
                pTVar7 = stack.c.
                         super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (stack.c.
                    super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    stack.c.
                    super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  pTVar7 = stack.c.
                           super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                }
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
                local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
                local_2a0._M_string_length = (size_type)pcVar17;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                pop_back(&stack.c);
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity = 0x100000004;
                local_2a0._M_string_length = (size_type)pcVar17;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                local_2a0._M_dataplus._M_p._0_4_ = 4;
                std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
                goto LAB_001056cc;
              }
            }
            if (cVar10 == (char)local_25c) {
              if (local_2a8 < pcVar17) {
                local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity = 1;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                local_2a8 = pcVar17;
              }
              if (stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                piVar9 = (invalid_formula *)__cxa_allocate_exception(0x10);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2a0,"Mismatched braces",&local_279);
                invalid_formula::invalid_formula(piVar9,&local_2a0);
                __cxa_throw(piVar9,&invalid_formula::typeinfo,std::runtime_error::~runtime_error);
              }
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar7 = stack.c.
                         super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
              }
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
              local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
              local_2a0._M_string_length = (size_type)pcVar17;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
              std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::pop_back
                        (&stack.c);
              pTVar7 = stack.c.
                       super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  stack.c.
                  super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar7 = stack.c.
                         super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
              }
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
              local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
              local_2a0._M_string_length = (size_type)pcVar17;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
LAB_00105511:
              std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::pop_back
                        (&stack.c);
            }
            else {
              if (cVar10 == ' ') {
                pcVar8 = local_278;
                pcVar13 = local_270;
                if (local_2a8 < pcVar17) {
                  local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                  local_2a0._M_dataplus._M_p = local_2a8;
                  local_2a0.field_2._M_allocated_capacity = 1;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  pcVar8 = local_278;
                  pcVar13 = local_270;
                  local_2a8 = pcVar17;
                }
                goto LAB_001058ec;
              }
              pcVar16 = pcVar17 + 2;
              if (pcVar16 <= local_278) {
                ppuVar14 = &PTR_anon_var_dwarf_1d11a_0011ea60;
                while (pcVar1 = *ppuVar14, pcVar1 != (char *)0x0) {
                  sVar6 = strlen(pcVar1);
                  bVar18 = _str_equals(pcVar1,sVar6,pcVar13,2);
                  ppuVar14 = ppuVar14 + 1;
                  if (bVar18) {
                    if (local_2a8 < pcVar17) {
                      local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                      local_2a0._M_dataplus._M_p = local_2a8;
                      local_2a0.field_2._M_allocated_capacity = 1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                      local_2a8 = pcVar17;
                    }
                    local_2a0._M_string_length = (size_type)(pcVar17 + 1);
                    local_2a0.field_2._M_allocated_capacity = 0x500000008;
                    local_2a0._M_dataplus._M_p = local_2a8;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    goto LAB_00104fcd;
                  }
                }
              }
              lVar11 = 0;
              do {
                if (lVar11 == 10) {
                  if (*pcVar13 == '%') {
                    if (local_2a8 < pcVar17) {
                      local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                      local_2a0._M_dataplus._M_p = local_2a8;
                      local_2a0.field_2._M_allocated_capacity = 1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                      local_2a8 = pcVar17;
                    }
                    local_2a0.field_2._M_allocated_capacity = 9;
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0._M_string_length = (size_type)pcVar17;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    goto LAB_001056cc;
                  }
                  cVar10 = *pcVar13;
                  if (cVar10 == '(') {
                    if (local_2a8 < pcVar17) {
                      local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                      local_2a0._M_dataplus._M_p = local_2a8;
                      local_2a0.field_2._M_allocated_capacity = 0x100000002;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                      local_2a0._M_dataplus._M_p._0_4_ = 2;
                      std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                      emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
                    }
                    else {
                      local_2a0._M_dataplus._M_p = local_2a8;
                      local_2a0.field_2._M_allocated_capacity = 0x100000005;
                      local_2a0._M_string_length = (size_type)pcVar17;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                      local_2a0._M_dataplus._M_p._0_4_ = 5;
                      std::deque<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>::
                      emplace_back<xlfparser::Token::Type>(&stack.c,(Type *)&local_2a0);
                    }
                    goto LAB_001056cc;
                  }
                  if (cVar10 != (char)local_260) {
                    if (cVar10 != ')') goto LAB_00105141;
                    if (local_2a8 < pcVar17) {
                      local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                      local_2a0._M_dataplus._M_p = local_2a8;
                      local_2a0.field_2._M_allocated_capacity = 1;
                      std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                      emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                      local_2a8 = pcVar17;
                    }
                    if (stack.c.
                        super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        stack.c.
                        super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      piVar9 = (invalid_formula *)__cxa_allocate_exception(0x10);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2a0,"Mismatched parentheses",&local_279);
                      invalid_formula::invalid_formula(piVar9,&local_2a0);
                      __cxa_throw(piVar9,&invalid_formula::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pTVar7 = stack.c.
                             super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                    if (stack.c.
                        super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        stack.c.
                        super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      pTVar7 = stack.c.
                               super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                    }
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0.field_2._M_allocated_capacity._4_4_ = 2;
                    local_2a0.field_2._M_allocated_capacity._0_4_ = pTVar7[-1];
                    local_2a0._M_string_length = (size_type)pcVar17;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    goto LAB_00105511;
                  }
                  if (local_2a8 < pcVar17) {
                    local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                    local_2a0._M_dataplus._M_p = local_2a8;
                    local_2a0.field_2._M_allocated_capacity = 1;
                    std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                    emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                    local_2a8 = pcVar17;
                  }
                  if (stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      stack.c.
                      super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00105761:
                    uVar20 = 8;
                    uVar21 = 0xb;
                  }
                  else {
                    pTVar7 = stack.c.
                             super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                    if (stack.c.
                        super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        stack.c.
                        super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      pTVar7 = stack.c.
                               super__Deque_base<xlfparser::Token::Type,_std::allocator<xlfparser::Token::Type>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                    }
                    uVar20 = 6;
                    uVar21 = 0;
                    if (pTVar7[-1] != Function) goto LAB_00105761;
                  }
                  local_2a0._M_dataplus._M_p = local_2a8;
                  local_2a0.field_2._M_allocated_capacity = CONCAT44(uVar21,uVar20);
                  local_2a0._M_string_length = (size_type)pcVar17;
                  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                  emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                  goto LAB_001056cc;
                }
                pcVar1 = "+-*/^&=><@" + lVar11;
                lVar11 = lVar11 + 1;
              } while (*pcVar1 != *pcVar13);
              if (local_2a8 < pcVar17) {
                local_2a0._M_string_length = (size_type)(pcVar17 + -1);
                local_2a0._M_dataplus._M_p = local_2a8;
                local_2a0.field_2._M_allocated_capacity = 1;
                std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
                emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
                local_2a8 = pcVar17;
              }
              local_2a0.field_2._M_allocated_capacity = 8;
              local_2a0._M_dataplus._M_p = local_2a8;
              local_2a0._M_string_length = (size_type)pcVar17;
              std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
              emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
            }
          }
LAB_001056cc:
          bVar15 = false;
          bVar19 = false;
          bVar18 = false;
          goto LAB_00105057;
        }
        if (local_2a8 < pcVar17) {
          local_2a0._M_string_length = (size_type)(pcVar17 + -1);
          local_2a0._M_dataplus._M_p = local_2a8;
          local_2a0.field_2._M_allocated_capacity = 0;
          std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::
          emplace_back<xlfparser::Token>(__return_storage_ptr__,(Token *)&local_2a0);
          local_2a8 = pcVar17;
        }
        bVar18 = true;
        bVar3 = false;
        bVar15 = false;
        bVar19 = false;
        pcVar16 = pcVar17 + 1;
        goto LAB_00104fe1;
      }
      bVar19 = true;
      bVar3 = false;
      bVar15 = false;
    }
    bVar18 = false;
    pcVar16 = pcVar17 + 1;
    goto LAB_00104fe1;
  }
  if ((cVar10 == '\'') && (pcVar17 + 2 <= local_278)) {
    bVar3 = false;
    pcVar16 = pcVar17 + 2;
    bVar15 = true;
    if (pcVar13[1] == '\'') goto LAB_00104fe1;
  }
  bVar3 = false;
  pcVar16 = pcVar17 + 1;
  bVar15 = cVar10 != '\'';
  goto LAB_00104fe1;
  while (pcVar17 = pcVar16 + 1, pcVar13[(long)pcVar16] == ' ') {
LAB_001058ec:
    pcVar16 = pcVar17;
    if (pcVar8 <= pcVar16) break;
  }
  local_2a0._M_string_length = (size_type)(pcVar16 + -1);
  local_2a0._M_dataplus._M_p = local_2a8;
  local_2a0.field_2._M_allocated_capacity = 10;
  std::vector<xlfparser::Token,_std::allocator<xlfparser::Token>_>::emplace_back<xlfparser::Token>
            (__return_storage_ptr__,(Token *)&local_2a0);
  goto LAB_00104fcd;
}

Assistant:

inline std::vector<Token> tokenize(const char_type *formula, size_t size, const Options<char_type>& options)
    {
        // Basic checks to make sure it's a valid formula
        if (size < 2 || formula[0] != '=')
            throw invalid_formula("Invalid Excel formula");

        // Chars used in parsing excel formual
        const char_type QUOTE_DOUBLE  = XLFP_CHAR('"');
        const char_type QUOTE_SINGLE  = XLFP_CHAR('\'');
        const char_type PAREN_OPEN    = XLFP_CHAR('(');
        const char_type PAREN_CLOSE   = XLFP_CHAR(')');
        const char_type WHITESPACE    = XLFP_CHAR(' ');
        const char_type ERROR_START   = XLFP_CHAR('#');

        // Some chars can be changed in the options
        const auto left_brace = options.left_brace.value_or(XLFP_CHAR('{'));
        const auto right_brace = options.right_brace.value_or(XLFP_CHAR('}'));
        const auto left_bracket = options.left_bracket.value_or(XLFP_CHAR('['));
        const auto right_bracket = options.right_brace.value_or(XLFP_CHAR(']'));
        const auto list_separator = options.list_separator.value_or(XLFP_CHAR(','));
        const auto decimal_separator = options.decimal_separator.value_or(XLFP_CHAR('.'));
        const auto row_separator = options.row_separator.value_or(XLFP_CHAR(';'));

        const char_type* OPERATORS_INFIX   = XLFP_STRING("+-*/^&=><@");
        const char_type* OPERATORS_POSTFIX = XLFP_STRING("%");

        // This matches a number in scientific notation with or without numbers after the + or -.
        // It's used to test for SN numbers before checking for +/- operators.
        std::basic_stringstream<char_type> sn_regex_ss;
        sn_regex_ss << R"(^[1-9](\)" << decimal_separator << R"(\d+)?E[+-]\d*$)";
        const std::basic_regex<char_type> sn_regex(sn_regex_ss.str(),
            std::regex_constants::ECMAScript |
            std::regex_constants::icase);

        const char_type* ERRORS[] = {
                XLFP_STRING("#NULL!"),
                XLFP_STRING("#DIV/0!"),
                XLFP_STRING("#VALUE!"),
                XLFP_STRING("#REF!"),
                XLFP_STRING("#NAME?"),
                XLFP_STRING("#NUM!"),
                XLFP_STRING("#N/A"),
                XLFP_STRING("#SPILL!"),
                NULL
        };

        const char_type* COMPARATORS_MULTI[] = {
                XLFP_STRING(">="),
                XLFP_STRING("<="),
                XLFP_STRING("<>"),
                NULL
        };

        bool in_string = false;
        bool in_path = false;
        bool in_range = false;
        bool in_error = false;

        std::vector<Token> tokens;
        std::stack<Token::Type> stack;

        size_t index = 1;  // first char is always '='
        size_t start = index;  // start of the current token
        while(index < size && formula[index] != L'\0')
        {
            // state-dependent character evaluation (order is important)

            // double-quoted strings
            // embeds are doubled
            // end marks token
            if (in_string) {
                if (formula[index] == QUOTE_DOUBLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_DOUBLE))
                    {
                        // '""' is a quoted '"' so skip both
                        index += 2;
                        continue;
                    }

                    // add the string token, exit the string and continue
                    tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Text));
                    start = ++index;
                    in_string = false;
                    continue;
                }

                ++index;
                continue;
            }

            // single-quoted strings (links)
            // embeds are double
            // end does not mark a token
            if (in_path)
            {
                if (formula[index] == QUOTE_SINGLE)
                {
                    if (((index + 2) <= size) && (formula[index + 1] == QUOTE_SINGLE))
                    {
                        // '' is a quoted ' so skip both
                        index += 2;
                        continue;
                    }

                    in_path = false;
                }

                ++index;
                continue;
            }

            // bracketed strings (R1C1 range index or linked workbook name)
            // no embeds (changed to "()" by Excel)
            // end does not mark a token
            if (in_range)
            {
                if (formula[index] == right_bracket)
                    in_range = false;

                index++;
                continue;
            }

            // error values
            // end marks a token, determined from absolute list of values
            if (in_error)
            {
                for (auto err = &ERRORS[0]; *err != NULL; ++err)
                {
                    if (_str_equals(*err, _tcslen(*err), &formula[start], 1 + index - start))
                    {
                        // add the string token, exit the string and continue
                        tokens.push_back(Token(start, index, Token::Type::Operand, Token::Subtype::Error));
                        start = index + 1;
                        in_error = false;
                        break;
                    }
                }

                ++index;
                continue;
            }

            // scientific notation check
            if (index > start)
            {
                if (std::regex_match(&formula[start], &formula[index]+1, sn_regex))
                {
                    ++index;
                    continue;
                }
            }

            // independent character evaluation (order not important)
            // establish state-dependent character evaluations
            if (formula[index] == QUOTE_DOUBLE) {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_string = true;
                ++index;
                continue;
            }

            if (formula[index] == QUOTE_SINGLE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_path = true;
                ++index;
                continue;
            }

            if (formula[index] == left_bracket)
            {
                in_range = true;
                ++index;
                continue;
            }

            if (formula[index] == ERROR_START)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                in_error = true;
                ++index;
                continue;
            }

            // mark start and end of arrays and array rows
            if (formula[index] == left_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Unknown, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, Token::Type::Array, Token::Subtype::Start));
                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));

                stack.push(Token::Type::Array);
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == row_separator && !stack.empty() && stack.top() == Token::Type::ArrayRow)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, Token::Type::ArrayRow, Token::Subtype::Start));
                stack.push(Token::Type::ArrayRow);

                start = ++index;
                continue;
            }

            if (formula[index] == right_brace)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched braces");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // trim white-space
            if (formula[index] == WHITESPACE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                while ((formula[index] == WHITESPACE) && (index < size))
                    index++;

                tokens.push_back(Token(start, index-1, Token::Type::Whitespace, Token::Subtype::None));

                start = index;
                continue;
            }

            // multi-character comparators
            if ((index + 2) <= size)
            {
                bool foundOp = false;
                for (auto op = &COMPARATORS_MULTI[0]; *op != NULL; ++op)
                {
                    if (_str_equals(*op, _tcslen(*op), &formula[index], 2))
                    {
                        if (index > start)
                        {
                            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                            start = index;
                        }

                        tokens.push_back(Token(start, index+1, Token::Type::OperatorInfix, Token::Subtype::Logical));
                        foundOp = true;
                        break;
                    }
                }

                if (foundOp)
                {
                    index += 2;
                    start = index;
                    continue;
                }
            }

            // standard infix operators
            bool foundOp = false;
            for (auto op = OPERATORS_INFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorInfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // standard postfix operators
            for (auto op = OPERATORS_POSTFIX; *op != L'\0'; ++op)
            {
                if (*op == formula[index])
                {
                    if (index > start)
                    {
                        tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                        start = index;
                    }

                    tokens.push_back(Token(start, index, Token::Type::OperatorPostfix, Token::Subtype::None));
                    foundOp = true;
                    break;
                }
            }

            if (foundOp)
            {
                start = ++index;
                continue;
            }

            // start subexpression or function
            if (formula[index] == PAREN_OPEN)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Function, Token::Subtype::Start));
                    stack.push(Token::Type::Function);
                }
                else
                {
                    tokens.push_back(Token(start, index, Token::Type::Subexpression, Token::Subtype::Start));
                    stack.push(Token::Type::Subexpression);
                }

                start = ++index;
                continue;
            }

            // function, subexpression, or array parameters, or operand unions
            if (formula[index] == list_separator)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                auto type = (!stack.empty() && stack.top() == Token::Type::Function)
                                ? std::make_tuple(Token::Type::Argument, Token::Subtype::None)
                                : std::make_tuple(Token::Type::OperatorInfix, Token::Subtype::Union);

                tokens.push_back(Token(start, index, std::get<0>(type), std::get<1>(type)));

                start = ++index;
                continue;
            }

            // stop subexpression
            if (formula[index] == PAREN_CLOSE)
            {
                if (index > start)
                {
                    tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));
                    start = index;
                }

                if (stack.empty())
                    throw invalid_formula("Mismatched parentheses");

                tokens.push_back(Token(start, index, stack.top(), Token::Subtype::Stop));
                stack.pop();

                start = ++index;
                continue;
            }

            // token accumulation
            ++index;
        }

        // dump remaining accumulation, if any
        if (index > start && (tokens.empty() || tokens.back().end() < start))
            tokens.push_back(Token(start, index-1, Token::Type::Operand, Token::Subtype::None));

        // label intersection operators specified as whitespace correctly
        tokens = _fix_whitespace_tokens(tokens, formula, size);

        // set the token subtypes correctly
        _infer_token_subtypes(tokens, options, formula, size);

        return tokens;
    }